

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O3

int vs_mark(bitstream *str,uint32_t val,int size)

{
  int iVar1;
  int iVar2;
  uint32_t tmp;
  uint local_c;
  
  local_c = val;
  iVar1 = vs_u(str,&local_c,size);
  iVar2 = 1;
  if (iVar1 == 0) {
    iVar2 = 0;
    if (local_c != val) {
      fprintf(_stderr,"Marker value invalid: %d vs %d\n",(ulong)local_c,val);
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

int vs_mark(struct bitstream *str, uint32_t val, int size) {
	uint32_t tmp = val;
	if (vs_u(str, &tmp, size)) return 1;
	if (tmp != val) {
		fprintf(stderr, "Marker value invalid: %d vs %d\n", tmp, val);
		return 1;
	}
	return 0;
}